

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O3

void __thiscall
glsl_type::glsl_type
          (glsl_type *this,GLenum gl_type,glsl_base_type base_type,uint vector_elements,
          uint matrix_columns,char *name,uint explicit_stride,bool row_major)

{
  void *ctx;
  char *pcVar1;
  
  this->gl_type = gl_type;
  *(glsl_base_type *)&this->field_0x4 =
       ((uint)row_major << 0x18 | base_type & 0xff) + (*(uint *)&this->field_0x4 & 0xfc000000) +
       0x1200;
  this->vector_elements = (uint8_t)vector_elements;
  this->matrix_columns = (uint8_t)matrix_columns;
  this->length = 0;
  this->explicit_stride = explicit_stride;
  ralloc_free((void *)0x0);
  ralloc_free((void *)0x0);
  ralloc_free((void *)0x0);
  ctx = ralloc_context((void *)0x0);
  this->mem_ctx = ctx;
  if (ctx == (void *)0x0) {
    __assert_fail("this->mem_ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                  ,0x46,
                  "glsl_type::glsl_type(GLenum, glsl_base_type, unsigned int, unsigned int, const char *, unsigned int, bool)"
                 );
  }
  if (name != (char *)0x0) {
    pcVar1 = ralloc_strdup(ctx,name);
    this->name = pcVar1;
    if ((matrix_columns != 0) != (vector_elements == 0)) {
      (this->fields).array = (glsl_type *)0x0;
      return;
    }
    __assert_fail("(vector_elements == 0) == (matrix_columns == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                  ,0x4d,
                  "glsl_type::glsl_type(GLenum, glsl_base_type, unsigned int, unsigned int, const char *, unsigned int, bool)"
                 );
  }
  __assert_fail("name != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                ,0x48,
                "glsl_type::glsl_type(GLenum, glsl_base_type, unsigned int, unsigned int, const char *, unsigned int, bool)"
               );
}

Assistant:

glsl_type::glsl_type(GLenum gl_type,
                     glsl_base_type base_type, unsigned vector_elements,
                     unsigned matrix_columns, const char *name,
                     unsigned explicit_stride, bool row_major) :
   gl_type(gl_type),
   base_type(base_type), sampled_type(GLSL_TYPE_VOID),
   sampler_dimensionality(0), sampler_shadow(0), sampler_array(0),
   interface_packing(0), interface_row_major(row_major), packed(0),
   vector_elements(vector_elements), matrix_columns(matrix_columns),
   length(0), explicit_stride(explicit_stride)
{
   /* Values of these types must fit in the two bits of
    * glsl_type::sampled_type.
    */
   STATIC_ASSERT((unsigned(GLSL_TYPE_UINT)  & 3) == unsigned(GLSL_TYPE_UINT));
   STATIC_ASSERT((unsigned(GLSL_TYPE_INT)   & 3) == unsigned(GLSL_TYPE_INT));
   STATIC_ASSERT((unsigned(GLSL_TYPE_FLOAT) & 3) == unsigned(GLSL_TYPE_FLOAT));

   ASSERT_BITFIELD_SIZE(glsl_type, base_type, GLSL_TYPE_ERROR);
   ASSERT_BITFIELD_SIZE(glsl_type, sampled_type, GLSL_TYPE_ERROR);
   ASSERT_BITFIELD_SIZE(glsl_type, sampler_dimensionality,
                        GLSL_SAMPLER_DIM_SUBPASS_MS);

   this->mem_ctx = ralloc_context(NULL);
   assert(this->mem_ctx != NULL);

   assert(name != NULL);
   this->name = ralloc_strdup(this->mem_ctx, name);

   /* Neither dimension is zero or both dimensions are zero.
    */
   assert((vector_elements == 0) == (matrix_columns == 0));
   memset(& fields, 0, sizeof(fields));
}